

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool __thiscall
cmFileCommand::HandleRPathChangeCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer __s;
  pointer __s_00;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  ostream *poVar6;
  int iVar7;
  pointer pbVar8;
  ulong uVar9;
  ulong uVar10;
  bool changed;
  string emsg;
  string file;
  cmFileTimes ft;
  ostringstream e;
  bool local_229;
  cmCommand *local_228;
  string local_220;
  string local_200;
  pointer local_1e0;
  pointer local_1d8;
  cmFileTimes local_1d0;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  local_200._M_string_length = 0;
  local_200.field_2._M_local_buf[0] = '\0';
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  iVar7 = 0;
  local_228 = &this->super_cmCommand;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8) < 0x21) {
    local_1d8 = (char *)0x0;
    local_1e0 = (char *)0x0;
  }
  else {
    local_1e0 = (pointer)0x0;
    local_1d8 = (pointer)0x0;
    uVar9 = 1;
    uVar10 = 2;
    do {
      iVar4 = std::__cxx11::string::compare((char *)(pbVar8 + uVar9));
      if (iVar4 == 0) {
        iVar7 = 2;
      }
      else {
        iVar4 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar9));
        if (iVar4 == 0) {
          iVar7 = 3;
        }
        else {
          iVar4 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar9));
          if (iVar4 == 0) {
            iVar7 = 1;
          }
          else {
            if (iVar7 == 3) {
              local_1e0 = (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar9]._M_dataplus._M_p;
            }
            else {
              if (iVar7 != 2) {
                if (iVar7 == 1) {
                  iVar7 = 0;
                  std::__cxx11::string::_M_assign((string *)&local_200);
                  goto LAB_001bbcd3;
                }
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"RPATH_CHANGE given unknown argument ",0x24);
                pbVar8 = (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,pbVar8[uVar9]._M_dataplus._M_p,
                           pbVar8[uVar9]._M_string_length);
                std::__cxx11::stringbuf::str();
                cmCommand::SetError(local_228,&local_220);
                goto LAB_001bc1f6;
              }
              local_1d8 = (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar9]._M_dataplus._M_p;
            }
            iVar7 = 0;
          }
        }
      }
LAB_001bbcd3:
      pbVar8 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      bVar3 = uVar10 < (ulong)((long)(args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5
                              );
      uVar9 = uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (bVar3);
  }
  __s_00 = local_1d8;
  __s = local_1e0;
  if (local_200._M_string_length == 0) {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"RPATH_CHANGE not given FILE option.","");
    cmCommand::SetError(local_228,(string *)local_1a8);
LAB_001bc0fb:
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  else {
    if (local_1d8 == (char *)0x0) {
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"RPATH_CHANGE not given OLD_RPATH option.","");
      cmCommand::SetError(local_228,(string *)local_1a8);
      goto LAB_001bc0fb;
    }
    if (local_1e0 == (char *)0x0) {
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"RPATH_CHANGE not given NEW_RPATH option.","");
      cmCommand::SetError(local_228,(string *)local_1a8);
      goto LAB_001bc0fb;
    }
    bVar3 = cmsys::SystemTools::FileExists(&local_200,true);
    if (bVar3) {
      cmFileTimes::cmFileTimes(&local_1d0,&local_200);
      local_220._M_string_length = 0;
      local_220.field_2._M_local_buf[0] = '\0';
      pcVar1 = local_1a8 + 0x10;
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      local_1a8._0_8_ = pcVar1;
      sVar5 = strlen(__s_00);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,__s_00,__s_00 + sVar5);
      paVar2 = &local_1c8.field_2;
      local_1c8._M_dataplus._M_p = (pointer)paVar2;
      sVar5 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,__s,__s + sVar5);
      bVar3 = cmSystemTools::ChangeRPath
                        (&local_200,(string *)local_1a8,&local_1c8,&local_220,&local_229);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != paVar2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if (bVar3) {
LAB_001bbf64:
        if (local_229 == true) {
          local_1a8._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,"Set runtime path of \"","");
          std::__cxx11::string::_M_append(local_1a8,(ulong)local_200._M_dataplus._M_p);
          std::__cxx11::string::append(local_1a8);
          std::__cxx11::string::append(local_1a8);
          std::__cxx11::string::append(local_1a8);
          cmMakefile::DisplayStatus(local_228->Makefile,(string *)local_1a8,-1.0);
          if ((pointer)local_1a8._0_8_ != pcVar1) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
        }
        cmFileTimes::Store(&local_1d0,&local_200);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"RPATH_CHANGE could not write new RPATH:\n",0x28);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
        sVar5 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"to the file:\n",0xd);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_200._M_dataplus._M_p,
                            local_200._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,local_220._M_dataplus._M_p,local_220._M_string_length);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(local_228,&local_1c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != paVar2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        if (bVar3) goto LAB_001bbf64;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p,
                        CONCAT71(local_220.field_2._M_allocated_capacity._1_7_,
                                 local_220.field_2._M_local_buf[0]) + 1);
      }
      cmFileTimes::~cmFileTimes(&local_1d0);
      goto LAB_001bc234;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"RPATH_CHANGE given FILE \"",0x19);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_200._M_dataplus._M_p,local_200._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" that does not exist.",0x16);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(local_228,&local_220);
LAB_001bc1f6:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,
                      CONCAT71(local_220.field_2._M_allocated_capacity._1_7_,
                               local_220.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  bVar3 = false;
LAB_001bc234:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,
                    CONCAT71(local_200.field_2._M_allocated_capacity._1_7_,
                             local_200.field_2._M_local_buf[0]) + 1);
  }
  return bVar3;
}

Assistant:

bool cmFileCommand::HandleRPathChangeCommand(
  std::vector<std::string> const& args)
{
  // Evaluate arguments.
  std::string file;
  const char* oldRPath = nullptr;
  const char* newRPath = nullptr;
  enum Doing
  {
    DoingNone,
    DoingFile,
    DoingOld,
    DoingNew
  };
  Doing doing = DoingNone;
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (args[i] == "OLD_RPATH") {
      doing = DoingOld;
    } else if (args[i] == "NEW_RPATH") {
      doing = DoingNew;
    } else if (args[i] == "FILE") {
      doing = DoingFile;
    } else if (doing == DoingFile) {
      file = args[i];
      doing = DoingNone;
    } else if (doing == DoingOld) {
      oldRPath = args[i].c_str();
      doing = DoingNone;
    } else if (doing == DoingNew) {
      newRPath = args[i].c_str();
      doing = DoingNone;
    } else {
      std::ostringstream e;
      e << "RPATH_CHANGE given unknown argument " << args[i];
      this->SetError(e.str());
      return false;
    }
  }
  if (file.empty()) {
    this->SetError("RPATH_CHANGE not given FILE option.");
    return false;
  }
  if (!oldRPath) {
    this->SetError("RPATH_CHANGE not given OLD_RPATH option.");
    return false;
  }
  if (!newRPath) {
    this->SetError("RPATH_CHANGE not given NEW_RPATH option.");
    return false;
  }
  if (!cmSystemTools::FileExists(file, true)) {
    std::ostringstream e;
    e << "RPATH_CHANGE given FILE \"" << file << "\" that does not exist.";
    this->SetError(e.str());
    return false;
  }
  bool success = true;
  cmFileTimes const ft(file);
  std::string emsg;
  bool changed;
  if (!cmSystemTools::ChangeRPath(file, oldRPath, newRPath, &emsg, &changed)) {
    std::ostringstream e;
    /* clang-format off */
    e << "RPATH_CHANGE could not write new RPATH:\n"
      << "  " << newRPath << "\n"
      << "to the file:\n"
      << "  " << file << "\n"
      << emsg;
    /* clang-format on */
    this->SetError(e.str());
    success = false;
  }
  if (success) {
    if (changed) {
      std::string message = "Set runtime path of \"";
      message += file;
      message += "\" to \"";
      message += newRPath;
      message += "\"";
      this->Makefile->DisplayStatus(message, -1);
    }
    ft.Store(file);
  }
  return success;
}